

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

idx_t duckdb::DateToStringCast::YearLength(int32_t *year,idx_t *year_length,bool *add_bc)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  *add_bc = false;
  iVar3 = *year;
  if (iVar3 < 1) {
    iVar3 = 1 - iVar3;
    *year = iVar3;
    *add_bc = true;
    lVar1 = 0xb;
  }
  else {
    lVar1 = 6;
  }
  lVar2 = (ulong)(999999 < iVar3) + (ulong)(99999 < iVar3) + (ulong)(9999 < iVar3);
  *year_length = lVar2 + (ulong)(9999999 < iVar3) + 4;
  return lVar1 + lVar2 + (ulong)(9999999 < iVar3) + 4;
}

Assistant:

static idx_t YearLength(int32_t &year, idx_t &year_length, bool &add_bc) {
		// format is YYYY-MM-DD with optional (BC) at the end
		// regular length is 10
		idx_t length = 6;
		year_length = 4;
		add_bc = false;
		if (year <= 0) {
			// add (BC) suffix
			length += 5;
			year = -year + 1;
			add_bc = true;
		}

		// potentially add extra characters depending on length of year
		year_length += year >= 10000;
		year_length += year >= 100000;
		year_length += year >= 1000000;
		year_length += year >= 10000000;
		length += year_length;
		return length;
	}